

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O2

void __thiscall sfc::Palette::save(Palette *this,string *path)

{
  pointer pSVar1;
  pointer this_00;
  byte_vec_t data;
  byte_vec_t nc;
  Subpalette spp;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  string *local_b8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  Subpalette local_80;
  
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (uchar *)0x0;
  pSVar1 = (this->_subpalettes).
           super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_b8 = path;
  for (this_00 = (this->_subpalettes).
                 super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pSVar1; this_00 = this_00 + 1) {
    Subpalette::padded(&local_80,this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,&local_80._colors);
    pack_native_colors((byte_vec_t *)&local_b0,(rgba_vec_t *)&local_98,this->_mode);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_98);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_d8,
               (const_iterator)local_d8._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_b0._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_b0._M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
    Subpalette::~Subpalette(&local_80);
  }
  write_file<unsigned_char>
            (local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
  return;
}

Assistant:

void Palette::save(const std::string& path) const {
  byte_vec_t data;
  for (const auto& sp : _subpalettes) {
    Subpalette spp = sp.padded();
    auto nc = pack_native_colors(spp.colors(), _mode);
    data.insert(data.end(), nc.begin(), nc.end());
  }
  write_file(path, data);
}